

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeView::dataChanged
          (QTreeView *this,QModelIndex *topLeft,QModelIndex *bottomRight,QList<int> *roles)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QTreeViewPrivate *this_00;
  reference pQVar8;
  QModelIndex *in_RDX;
  QTreeViewPrivate *in_RSI;
  QModelIndex *in_RDI;
  bool bVar9;
  QAbstractItemView *unaff_retaddr;
  QTreeViewPrivate *in_stack_00000018;
  int oldHeight_1;
  int i;
  int bottomViewIndex;
  int oldHeight;
  int newDefaultItemHeight;
  int topViewIndex;
  bool sizeChanged;
  QTreeViewPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QTreeViewPrivate *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  this_00 = d_func((QTreeView *)0x8f04bb);
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout & 1U) == 0) {
    bVar9 = false;
    iVar2 = QTreeViewPrivate::viewIndex(in_RSI,in_RDX);
    if (iVar2 == 0) {
      iVar3 = indexRowSizeHint((QTreeView *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (QModelIndex *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      bVar9 = this_00->defaultItemHeight != iVar3;
      this_00->defaultItemHeight = iVar3;
    }
    if (iVar2 != -1) {
      iVar3 = QModelIndex::row((QModelIndex *)in_RSI);
      iVar4 = QModelIndex::row(in_RDX);
      if (iVar3 == iVar4) {
        iVar2 = QTreeViewPrivate::itemHeight
                          ((QTreeViewPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa4);
        QTreeViewPrivate::invalidateHeightCache(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
        ;
        iVar4 = QTreeViewPrivate::itemHeight
                          ((QTreeViewPrivate *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffa4);
        bVar9 = bVar9 || iVar2 != iVar4;
        iVar4 = QModelIndex::column((QModelIndex *)in_RSI);
        if (iVar4 == 0) {
          bVar1 = QTreeViewPrivate::hasVisibleChildren
                            ((QTreeViewPrivate *)CONCAT44(iVar3,iVar2),
                             (QModelIndex *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          uVar5 = (uint)bVar1;
          pQVar8 = QList<QTreeViewItem>::operator[]
                             ((QList<QTreeViewItem> *)in_stack_ffffffffffffff90,
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          *(ulong *)&pQVar8->field_0x1c =
               *(ulong *)&pQVar8->field_0x1c & 0xfffffffffffffffb | ((ulong)uVar5 & 1) << 2;
        }
      }
      else {
        iVar4 = QTreeViewPrivate::viewIndex(in_RSI,in_RDX);
        for (; iVar2 <= iVar4; iVar2 = iVar2 + 1) {
          iVar6 = QTreeViewPrivate::itemHeight
                            ((QTreeViewPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa4);
          QTreeViewPrivate::invalidateHeightCache
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          iVar7 = QTreeViewPrivate::itemHeight
                            ((QTreeViewPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa4);
          bVar9 = bVar9 || iVar6 != iVar7;
          iVar7 = QModelIndex::column((QModelIndex *)in_RSI);
          if (iVar7 == 0) {
            in_stack_ffffffffffffff90 = this_00;
            QList<QTreeViewItem>::at
                      ((QList<QTreeViewItem> *)this_00,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            bVar1 = QTreeViewPrivate::hasVisibleChildren
                              ((QTreeViewPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                               (QModelIndex *)CONCAT44(in_stack_ffffffffffffffa4,iVar6));
            pQVar8 = QList<QTreeViewItem>::operator[]
                               ((QList<QTreeViewItem> *)in_stack_ffffffffffffff90,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            *(ulong *)&pQVar8->field_0x1c =
                 *(ulong *)&pQVar8->field_0x1c & 0xfffffffffffffffb | (ulong)bVar1 << 2;
          }
        }
      }
    }
    if (bVar9) {
      QTreeViewPrivate::updateScrollBars(in_stack_00000018);
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    QAbstractItemView::dataChanged(unaff_retaddr,in_RDI,(QModelIndex *)in_RSI,(QList<int> *)in_RDX);
  }
  return;
}

Assistant:

void QTreeView::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight,
                            const QList<int> &roles)
{
    Q_D(QTreeView);

    // if we are going to do a complete relayout anyway, there is no need to update
    if (d->delayedPendingLayout)
        return;

    // refresh the height cache here; we don't really lose anything by getting the size hint,
    // since QAbstractItemView::dataChanged() will get the visualRect for the items anyway

    bool sizeChanged = false;
    int topViewIndex = d->viewIndex(topLeft);
    if (topViewIndex == 0) {
        int newDefaultItemHeight = indexRowSizeHint(topLeft);
        sizeChanged = d->defaultItemHeight != newDefaultItemHeight;
        d->defaultItemHeight = newDefaultItemHeight;
    }

    if (topViewIndex != -1) {
        if (topLeft.row() == bottomRight.row()) {
            int oldHeight = d->itemHeight(topViewIndex);
            d->invalidateHeightCache(topViewIndex);
            sizeChanged |= (oldHeight != d->itemHeight(topViewIndex));
            if (topLeft.column() == 0)
                d->viewItems[topViewIndex].hasChildren = d->hasVisibleChildren(topLeft);
        } else {
            int bottomViewIndex = d->viewIndex(bottomRight);
            for (int i = topViewIndex; i <= bottomViewIndex; ++i) {
                int oldHeight = d->itemHeight(i);
                d->invalidateHeightCache(i);
                sizeChanged |= (oldHeight != d->itemHeight(i));
                if (topLeft.column() == 0)
                    d->viewItems[i].hasChildren = d->hasVisibleChildren(d->viewItems.at(i).index);
            }
        }
    }

    if (sizeChanged) {
        d->updateScrollBars();
        d->viewport->update();
    }
    QAbstractItemView::dataChanged(topLeft, bottomRight, roles);
}